

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-adapter.cpp
# Opt level: O3

bool __thiscall
llama_adapter_cvec::apply
          (llama_adapter_cvec *this,llama_model *model,float *data,size_t len,int32_t n_embd,
          int32_t il_start,int32_t il_end)

{
  ggml_tensor *pgVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (data == (float *)0x0) {
    this->layer_start = -1;
    this->layer_end = -1;
  }
  else {
    if ((model->hparams).n_embd != n_embd) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: control vector n_embd does not match model\n",
                         "apply");
      return false;
    }
    if (((this->tensors).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
         super__Vector_impl_data._M_start ==
         (this->tensors).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
         super__Vector_impl_data._M_finish) && (iVar2 = init(this,model), (char)iVar2 == '\0')) {
      return false;
    }
    this->layer_start = il_start;
    this->layer_end = il_end;
    uVar3 = (model->hparams).n_layer;
    if (uVar3 < 2) {
      return true;
    }
    uVar5 = (ulong)n_embd;
    uVar7 = 1;
    uVar6 = uVar5;
    do {
      if (uVar6 <= len) {
        pgVar1 = (this->tensors).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar7];
        lVar4 = ggml_element_size(pgVar1);
        ggml_backend_tensor_set(pgVar1,data,0,lVar4 * uVar5);
        uVar3 = (model->hparams).n_layer;
      }
      uVar7 = uVar7 + 1;
      data = data + uVar5;
      uVar6 = uVar6 + uVar5;
    } while (uVar7 < uVar3);
  }
  return true;
}

Assistant:

bool llama_adapter_cvec::apply(
        const llama_model & model,
        const float * data,
        size_t len,
        int32_t n_embd,
        int32_t il_start,
        int32_t il_end) {
    const auto & hparams = model.hparams;

    if (data == nullptr) {
        // disable the current control vector (but leave allocated for later)
        layer_start = -1;
        layer_end   = -1;
        return true;
    }

    if (n_embd != (int) hparams.n_embd) {
        LLAMA_LOG_ERROR("%s: control vector n_embd does not match model\n", __func__);
        return false;
    }

    if (tensors.empty()) {
        if (!init(model)) {
            return false;
        }
    }

    layer_start = il_start;
    layer_end   = il_end;

    for (size_t il = 1; il < hparams.n_layer; il++) {
        assert(tensors[il] != nullptr);

        const size_t off = n_embd * (il - 1); // buffer doesn't have data for layer 0, since it's never present
        if (off + n_embd <= len) {
            ggml_backend_tensor_set(tensors[il], data + off, 0, n_embd * ggml_element_size(tensors[il]));
        }
    }

    return true;
}